

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

bool clip_model_quantize(char *fname_inp,char *fname_out,int itype)

{
  gguf_context *pgVar1;
  ggml_context *pgVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  pointer pbVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  value_type_conflict3 *__val;
  undefined8 uVar8;
  undefined8 uVar9;
  size_type sVar10;
  void *pvVar11;
  char *__s;
  int *piVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  uint uVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  pointer __s_00;
  bool bVar21;
  float fVar22;
  undefined1 auVar23 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<unsigned_char,_std::allocator<unsigned_char>_> meta;
  vector<float,_std::allocator<float>_> conv_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  k_names;
  ofstream fout;
  long local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  vector<float,_std::allocator<float>_> local_348;
  undefined1 local_328 [16];
  pointer local_318;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  long local_300;
  long local_2f8 [2];
  undefined1 local_2e8 [24];
  size_type local_2d0;
  pointer local_2c8;
  uint local_2bc;
  clip_ctx *local_2b8;
  ulong local_2b0;
  ggml_context *local_2a8;
  gguf_context *local_2a0;
  ulong local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  long local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2b8 = clip_init(fname_inp,(clip_context_params)0x400000000);
  pgVar1 = (local_2b8->ctx_gguf)._M_t.super___uniq_ptr_impl<gguf_context,_gguf_context_deleter>._M_t
           .super__Tuple_impl<0UL,_gguf_context_*,_gguf_context_deleter>.
           super__Head_base<0UL,_gguf_context_*,_false>._M_head_impl;
  pgVar2 = (local_2b8->ctx_data)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t
           .super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
  uVar8 = gguf_init_empty();
  gguf_set_kv(uVar8,pgVar1);
  gguf_set_val_u32(uVar8,"general.quantization_version",2);
  gguf_set_val_u32(uVar8,"general.file_type",itype);
  std::ofstream::ofstream(&local_230,fname_out,_S_bin);
  uVar6 = gguf_get_n_tensors(pgVar1);
  if (0 < (int)uVar6) {
    uVar19 = 0;
    do {
      uVar9 = gguf_get_tensor_name(pgVar1,uVar19);
      uVar9 = ggml_get_tensor(pgVar2,uVar9);
      gguf_add_tensor(uVar8,uVar9);
      uVar19 = uVar19 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar19);
  }
  sVar10 = gguf_get_meta_size(uVar8);
  local_2d0 = sVar10;
  if (sVar10 != 0) {
    do {
      std::ostream::put((char)&local_230);
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  local_368._M_dataplus._M_p = (pointer)((long)&local_368 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,".*weight","");
  __l._M_len = 1;
  __l._M_array = &local_368;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_290,__l,(allocator_type *)&local_308);
  if (local_368._M_dataplus._M_p != (pointer)((long)&local_368 + 0x10)) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  local_328 = (undefined1  [16])0x0;
  local_318 = (pointer)0x0;
  pvVar11 = operator_new(0x200);
  local_328._8_8_ = pvVar11;
  local_328._0_8_ = pvVar11;
  local_318 = (pointer)((long)pvVar11 + 0x200);
  memset(pvVar11,0,0x200);
  local_328._8_8_ = (pointer)((long)pvVar11 + 0x200);
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar11 = operator_new(0x800);
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pvVar11;
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pvVar11;
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((long)pvVar11 + 0x800);
  memset(pvVar11,0,0x800);
  local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((long)pvVar11 + 0x800);
  bVar21 = (int)uVar6 < 1;
  if ((int)uVar6 < 1) {
    local_2e8._0_16_ = (undefined1  [16])0x0;
  }
  else {
    local_2b0 = (ulong)(uVar6 & 0x7fffffff);
    uVar19 = 0;
    local_2e8._0_16_ = (undefined1  [16])0x0;
    local_2a8 = pgVar2;
    local_2a0 = pgVar1;
    do {
      local_298 = uVar19;
      __s = (char *)gguf_get_tensor_name(local_2a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,__s,(allocator<char> *)&local_368);
      piVar12 = (int *)ggml_get_tensor(local_2a8,local_308._M_current);
      pbVar4 = local_290.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar18 = 0;
      uVar6 = 0;
      __s_00 = local_290.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_290.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_290.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_250,__s_00,0x10);
          local_368.field_2 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )0x0;
          local_368._M_dataplus._M_p = (pointer)0x0;
          local_368._M_string_length = 0;
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (local_308,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_308._M_current + local_300),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)&local_368,&local_250,0);
          if (local_368._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_368._M_dataplus._M_p,
                            local_368.field_2._M_allocated_capacity -
                            (long)local_368._M_dataplus._M_p);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_250);
          if (bVar5) {
            bVar18 = 1;
          }
          __s_00 = __s_00 + 1;
        } while (__s_00 != pbVar4 && !bVar5);
        uVar6 = (uint)bVar18;
      }
      iVar7 = ggml_n_dims(piVar12);
      uVar17 = 0;
      if (iVar7 == 2) {
        lVar14 = *(long *)(piVar12 + 4);
        lVar13 = ggml_blck_size(itype);
        uVar17 = (uint)(lVar13 < lVar14);
      }
      local_2bc = uVar17 & uVar6;
      if (local_2bc == 0) {
        iVar7 = *piVar12;
        local_2c8 = *(pointer *)(piVar12 + 0x3e);
        local_370 = ggml_nbytes(piVar12);
LAB_0012bb98:
        lVar14 = ggml_nbytes(piVar12);
        gguf_set_tensor_type(uVar8,local_308._M_current,iVar7);
        uVar9 = gguf_find_tensor(uVar8,local_308._M_current);
        lVar13 = gguf_get_tensor_size(uVar8,uVar9);
        if (lVar13 != local_370) {
          uVar8 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                             ,0xc37,"GGML_ASSERT(%s) failed",
                             "gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size"
                            );
          if (local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_348.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_348.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_328._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_290);
          std::ofstream::~ofstream(&local_230);
          _Unwind_Resume(uVar8);
        }
        gguf_set_tensor_data(uVar8,local_308._M_current,local_2c8);
        std::ostream::write((char *)&local_230,(long)local_2c8);
        lVar13 = gguf_get_alignment(uVar8);
        lVar16 = gguf_get_alignment(uVar8);
        _Var3._M_current = local_308._M_current;
        for (lVar13 = (-lVar16 & (local_370 + lVar13) - 1U) - local_370;
            local_308._M_current = _Var3._M_current, lVar13 != 0; lVar13 = lVar13 + -1) {
          std::ostream::put((char)&local_230);
          _Var3._M_current = local_308._M_current;
        }
        local_2e8._8_8_ = local_2e8._8_8_ + local_370;
        local_2e8._0_8_ = local_2e8._0_8_ + lVar14;
        bVar5 = true;
        if ((int)g_logger_state.verbosity_thold < 3) {
          uStack_270 = 0;
          local_268 = local_370;
          uStack_260 = 0;
          local_278 = lVar14;
          ggml_n_dims(piVar12);
          auVar23._8_4_ = (int)((ulong)local_278 >> 0x20);
          auVar23._0_8_ = local_278;
          auVar23._12_4_ = 0x45300000;
          clip_log_internal(GGML_LOG_LEVEL_INFO,
                            "%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n",
                            ((auVar23._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_278) - 4503599627370496.0)) *
                            0.0009765625 * 0.0009765625,
                            (((double)CONCAT44(0x45300000,local_268._4_4_) - 1.9342813113834067e+25)
                            + ((double)CONCAT44(0x43300000,(undefined4)local_268) -
                              4503599627370496.0)) * 0.0009765625 * 0.0009765625,_Var3._M_current);
        }
      }
      else {
        iVar7 = itype;
        if (9 < itype) {
          lVar14 = std::__cxx11::string::find((char *)&local_308,0x15551f,0);
          iVar7 = 8;
          if (lVar14 == -1) {
            iVar7 = itype;
          }
        }
        uVar19 = ggml_nelements(piVar12);
        if (*piVar12 == 0) {
          piVar15 = piVar12 + 0x3e;
LAB_0012bafe:
          uVar9 = *(undefined8 *)piVar15;
          if ((ulong)(local_328._8_8_ - local_328._0_8_) < uVar19 << 2) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_328,
                       uVar19 << 2);
          }
          local_2c8 = (pointer)local_328._0_8_;
          local_370 = ggml_quantize_chunk(iVar7,uVar9,local_328._0_8_);
          bVar5 = true;
        }
        else {
          if (*piVar12 == 1) {
            if ((ulong)((long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) < uVar19) {
              std::vector<float,_std::allocator<float>_>::resize(&local_348,uVar19);
            }
            piVar15 = (int *)&local_348;
            if (uVar19 != 0) {
              uVar20 = 0;
              do {
                fVar22 = (float)ggml_fp16_to_fp32(*(undefined2 *)
                                                   (*(long *)(piVar12 + 0x3e) + uVar20 * 2));
                local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20] = fVar22;
                uVar20 = uVar20 + 1;
              } while (uVar19 != uVar20);
              piVar15 = (int *)&local_348;
            }
            goto LAB_0012bafe;
          }
          if ((int)g_logger_state.verbosity_thold < 5) {
            clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: Please use an input file in f32 or f16\n",
                              "clip_model_quantize");
          }
          gguf_free(uVar8);
          bVar5 = false;
        }
        if (bVar5) goto LAB_0012bb98;
        bVar5 = false;
      }
      if ((long *)local_308._M_current != local_2f8) {
        operator_delete(local_308._M_current,local_2f8[0] + 1);
      }
      if (!bVar5) break;
      uVar19 = local_298 + 1;
      bVar21 = local_2b0 <= uVar19;
    } while (uVar19 != local_2b0);
    local_2e8._8_8_ =
         (((double)((ulong)local_2e8._8_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(local_2e8._8_8_ & 0xffffffff | 0x4330000000000000)) * 0.0009765625 * 0.0009765625;
    local_2e8._0_8_ =
         (((double)((ulong)local_2e8._0_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
         (double)(local_2e8._0_8_ & 0xffffffff | 0x4330000000000000)) * 0.0009765625 * 0.0009765625;
  }
  if (bVar21 != false) {
    std::ostream::seekp((long)&local_230,_S_beg);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_368,local_2d0,
               (allocator_type *)&local_308);
    gguf_get_meta_data(uVar8,local_368._M_dataplus._M_p);
    std::ostream::write((char *)&local_230,(long)local_368._M_dataplus._M_p);
    std::ofstream::close();
    clip_free(local_2b8);
    gguf_free(uVar8);
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: original  size = %8.2f MB\n",local_2e8._0_8_,
                        "clip_model_quantize");
    }
    if ((int)g_logger_state.verbosity_thold < 3) {
      clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: quantized size = %8.2f MB\n",local_2e8._8_8_,
                        "clip_model_quantize");
    }
    if (local_368._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_368._M_dataplus._M_p,
                      local_368.field_2._M_allocated_capacity - (long)local_368._M_dataplus._M_p);
    }
  }
  if (local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_328._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return bVar21;
}

Assistant:

bool clip_model_quantize(const char * fname_inp, const char * fname_out, const int itype) {
    assert(itype < GGML_TYPE_COUNT);
    ggml_type type = static_cast<ggml_type>(itype);

    auto * ctx_clip = clip_init(fname_inp, clip_context_params{
        /* use_gpu */   false,
        /* verbosity */ GGML_LOG_LEVEL_ERROR,
    });

    const auto & ctx_src = ctx_clip->ctx_gguf.get();
    const auto & ctx_data = ctx_clip->ctx_data.get();

    auto * ctx_out = gguf_init_empty();
    gguf_set_kv(ctx_out, ctx_src);
    gguf_set_val_u32(ctx_out, "general.quantization_version", GGML_QNT_VERSION);
    gguf_set_val_u32(ctx_out, "general.file_type", itype);

    auto fout = std::ofstream(fname_out, std::ios::binary);

    const int n_tensors = gguf_get_n_tensors(ctx_src);

    for (int i = 0; i < n_tensors; ++i) {
        const char * name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name);
        gguf_add_tensor(ctx_out, cur);
    }

    const size_t meta_size = gguf_get_meta_size(ctx_out);
    for (size_t i = 0; i < meta_size; ++i) {
        fout.put(0);
    }

    // regexes of tensor names to be quantized
    const std::vector<std::string> k_names = {
        ".*weight",
    };

    std::vector<uint8_t> work(512);
    std::vector<float> conv_buf(512);
    size_t total_size_org = 0;
    size_t total_size_new = 0;

    for (int i = 0; i < n_tensors; ++i) {
        const std::string name = gguf_get_tensor_name(ctx_src, i);
        struct ggml_tensor * cur = ggml_get_tensor(ctx_data, name.c_str());

        enum ggml_type new_type;
        void * new_data;
        size_t new_size;

        bool quantize = false;
        for (const auto & s : k_names) {
            if (std::regex_match(name, std::regex(s))) {
                quantize = true;
                break;
            }
        }

        // quantize only 2D tensors and bigger than block size
        quantize &= (ggml_n_dims(cur) == 2) && cur->ne[0] > ggml_blck_size(type);

        if (quantize) {
            new_type = type;
            if (new_type >= GGML_TYPE_Q2_K && name.find("embd") != std::string::npos) {
                new_type = GGML_TYPE_Q8_0; // ggml_get_rows needs non K type
                // LOG_ERR("%s: quantizing %s to %s\n", __func__, name.c_str(), ggml_type_name(new_type));
            }
            const size_t n_elms = ggml_nelements(cur);
            float * f32_data;

            switch (cur->type) {
            case GGML_TYPE_F32:
                f32_data = (float *)cur->data;
                break;
            case GGML_TYPE_F16:
                if (conv_buf.size() < n_elms) {
                    conv_buf.resize(n_elms);
                }
                for (size_t j = 0; j < n_elms; ++j) {
                    conv_buf[j] = ggml_fp16_to_fp32(((ggml_fp16_t *)cur->data)[j]);
                }
                f32_data = (float *)conv_buf.data();
                break;
            default:
                LOG_ERR("%s: Please use an input file in f32 or f16\n", __func__);
                gguf_free(ctx_out);
                return false;
            }

            if (work.size() < n_elms * 4) {
                work.resize(n_elms * 4);
            }
            new_data = work.data();

            new_size = ggml_quantize_chunk(new_type, f32_data, new_data, 0, n_elms/cur->ne[0], cur->ne[0], nullptr);
        } else {
            new_type = cur->type;
            new_data = cur->data;
            new_size = ggml_nbytes(cur);
        }
        const size_t orig_size = ggml_nbytes(cur);
        total_size_org += orig_size;
        total_size_new += new_size;
        gguf_set_tensor_type(ctx_out, name.c_str(), new_type);
        GGML_ASSERT(gguf_get_tensor_size(ctx_out, gguf_find_tensor(ctx_out, name.c_str())) == new_size);
        gguf_set_tensor_data(ctx_out, name.c_str(), new_data);
        fout.write((const char *)new_data, new_size);
        size_t pad = GGML_PAD(new_size, gguf_get_alignment(ctx_out)) - new_size;
        for (size_t j = 0; j < pad; ++j) {
            fout.put(0);
        }

        LOG_INF("%s: n_dims = %d | quantize=%d | size = %f MB -> %f MB\n", name.c_str(), ggml_n_dims(cur), quantize,
               orig_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
    }

    // go back to beginning of file and write the updated metadata
    fout.seekp(0, std::ios::beg);
    std::vector<uint8_t> meta(meta_size);
    gguf_get_meta_data(ctx_out, meta.data());
    fout.write((const char *)meta.data(), meta_size);

    fout.close();

    clip_free(ctx_clip);
    gguf_free(ctx_out);

    {
        LOG_INF("%s: original  size = %8.2f MB\n", __func__, total_size_org / 1024.0 / 1024.0);
        LOG_INF("%s: quantized size = %8.2f MB\n", __func__, total_size_new / 1024.0 / 1024.0);
    }

    return true;
}